

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsLineItem::setPen(QGraphicsLineItem *this,QPen *pen)

{
  long lVar1;
  QGraphicsLineItemPrivate *pQVar2;
  ulong uVar3;
  QPen *in_RSI;
  long in_FS_OFFSET;
  QGraphicsLineItemPrivate *d;
  QRectF *in_stack_ffffffffffffffd8;
  QGraphicsItem *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsLineItem *)0x98a40e);
  uVar3 = QPen::operator==(&pQVar2->pen,in_RSI);
  if ((uVar3 & 1) == 0) {
    QGraphicsItem::prepareGeometryChange((QGraphicsItem *)d);
    QPen::operator=(&pQVar2->pen,in_RSI);
    QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8);
    QGraphicsItem::update(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsLineItem::setPen(const QPen &pen)
{
    Q_D(QGraphicsLineItem);
    if (d->pen == pen)
        return;
    prepareGeometryChange();
    d->pen = pen;
    update();
}